

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all_at_one.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong X;
  vector<unsigned_long,_std::allocator<unsigned_long>_> threads;
  vector<Argument,_std::allocator<Argument>_> args;
  long local_70;
  ulong local_68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<Argument,_std::allocator<Argument>_> local_48;
  
  uVar2 = parse_arg(argc,argv);
  std::vector<Argument,_std::allocator<Argument>_>::vector
            (&local_48,uVar2,(allocator_type *)&local_60);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_60,uVar2,(allocator_type *)&local_70);
  local_70 = 0;
  lVar5 = uVar2 * 8;
  iVar6 = 0;
  lVar3 = uVar2 << 4;
  local_68 = uVar2;
  do {
    uVar2 = uVar2 - 1;
    lVar5 = lVar5 + -8;
    if (uVar2 == 0) goto LAB_00102601;
    *(long **)((long)&local_48.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                      super__Vector_impl_data._M_start[-1].x + lVar3) = &local_70;
    *(ulong *)((long)&local_48.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                      super__Vector_impl_data._M_start[-1].n + lVar3) = uVar2;
    iVar1 = pthread_create((pthread_t *)
                           ((long)local_60.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar5),
                           (pthread_attr_t *)0x0,parallel_inc,
                           (void *)((long)&local_48.
                                           super__Vector_base<Argument,_std::allocator<Argument>_>.
                                           _M_impl.super__Vector_impl_data._M_start[-1].x + lVar3));
    lVar3 = lVar3 + -0x10;
  } while (iVar1 == 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"pthread_create() terminated with code ",0x26);
  iVar6 = -1;
  std::ostream::operator<<((ostream *)&std::cerr,iVar1);
LAB_00102601:
  if (uVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Master thread",0xd);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    uVar2 = local_68;
    local_70 = local_70 + 1;
    if (1 < local_68) {
      uVar4 = 1;
      do {
        pthread_join(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar4],(void **)0x0);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    iVar6 = 0;
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int main(int argc, char *argv[]) {
  ulong N;
  try{
    N = parse_arg(argc, argv);
  }catch(std::runtime_error &err){
    std::cerr << err.what();
    return -1;
  }
  std::vector<Argument> args(N);
  std::vector<pthread_t> threads(N);
  ulong X = 0;
  for(ulong i = N - 1; i > 0; --i){
    args[i] = {&X, i};
    int ret;
    if((ret = pthread_create(threads.data() + i, nullptr, parallel_inc,
                      reinterpret_cast<void *>(args.data() + i))) != 0){
      std::cerr << "pthread_create() terminated with code " << ret;
      return -1;
    }
  }
  std::cout << "Master thread" << std::endl;
  ++X;
  for(ulong i = 1; i < N; ++i){
    pthread_join(threads[i], nullptr);
  }
  return 0;
}